

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.cpp
# Opt level: O2

bool __thiscall Kernel::TopLevelVarLikeTermIterator::hasNext(TopLevelVarLikeTermIterator *this)

{
  Term **ppTVar1;
  int iVar2;
  bool bVar3;
  Term *term;
  bool bVar4;
  TermList tl;
  TermList head;
  TermList local_40;
  TermList local_38;
  
  if ((hasNext()::args == '\0') && (iVar2 = __cxa_guard_acquire(&hasNext()::args), iVar2 != 0)) {
    hasNext::args._cursor = (TermList *)0x0;
    hasNext::args._end = (TermList *)0x0;
    hasNext::args._capacity = 0;
    hasNext::args._stack = (TermList *)0x0;
    __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&hasNext::args,&__dso_handle);
    __cxa_guard_release(&hasNext()::args);
  }
  local_38._content = 2;
  bVar3 = true;
  if (this->_next == (Term *)0x0) {
    do {
      ppTVar1 = (this->_stack)._cursor;
      bVar4 = ppTVar1 == (this->_stack)._stack;
      bVar3 = !bVar4;
      if (bVar4) {
        return false;
      }
      (this->_stack)._cursor = ppTVar1 + -1;
      term = ppTVar1[-1];
      ApplicativeHelper::getHeadAndArgs(term,&local_38,&hasNext::args);
      if ((((local_38._content & 1) != 0) && (hasNext::args._cursor != hasNext::args._stack)) ||
         ((bVar4 = ApplicativeHelper::isComb(local_38), bVar4 &&
          ((bVar4 = ApplicativeHelper::isUnderApplied
                              (local_38,(uint)((ulong)((long)hasNext::args._cursor -
                                                      (long)hasNext::args._stack) >> 3)), !bVar4 &&
           (bVar4 = Term::ground(term), !bVar4)))))) {
        this->_next = term;
      }
      else {
        while (hasNext::args._cursor != hasNext::args._stack) {
          local_40._content = hasNext::args._cursor[-1]._content;
          hasNext::args._cursor = hasNext::args._cursor + -1;
          bVar4 = TermList::isApplication(&local_40);
          if ((bVar4) && (bVar4 = Term::ground((Term *)local_40._content), !bVar4)) {
            Lib::Stack<Kernel::Term_*>::push(&this->_stack,(Term *)local_40._content);
          }
        }
        term = this->_next;
      }
    } while (term == (Term *)0x0);
  }
  return bVar3;
}

Assistant:

bool TopLevelVarLikeTermIterator::hasNext()
{
  static TermStack args;
  TermList head;
  
  if(_next){ return true; }
  while(!_stack.isEmpty()){
    Term* t = _stack.pop();
    ASS(t->isApplication());
    AH::getHeadAndArgs(t, head, args);
    ASS(args.size());
    if(head.isVar() && args.size()){
      _next = t;
    } else if(AH::isComb(head) && !AH::isUnderApplied(head, args.size()) && !t->ground()){
      _next = t;
    } else {
      while(!args.isEmpty()){
        TermList tl = args.pop();
        if(tl.isApplication() && !tl.term()->ground()){
          _stack.push(tl.term());
        }
      }
    }
    if(_next) { return true; }
  }
  return false;  
}